

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<vkb::Result<vkb::Device>_&>::streamReconstructedExpression
          (UnaryExpr<vkb::Result<vkb::Device>_&> *this,ostream *os)

{
  Result<vkb::Device> *in_RDX;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  UnaryExpr<vkb::Result<vkb::Device>_&> *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::stringify<vkb::Result<vkb::Device>>(&local_38,(Detail *)this->m_lhs,in_RDX);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }